

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec2 vec2_reflect(vec2 u,vec2 v)

{
  vec2 vVar1;
  vec2 v2;
  vec2 v_local;
  vec2 u_local;
  
  vVar1 = vec2_perpindicular_component(u,v);
  v2 = vec2_parallel_component(u,v);
  vVar1 = vec2_sub(vVar1,v2);
  return vVar1;
}

Assistant:

vec2 vec2_reflect(vec2 u, vec2 v) {
    return vec2_sub(vec2_perpindicular_component(u, v), vec2_parallel_component(u, v));
}